

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O2

OutboundPacketStream * __thiscall
osc::OutboundPacketStream::operator<<(OutboundPacketStream *this,char *rhs)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = strlen(rhs);
  CheckForAvailableArgumentSpace(this,(sVar2 & 0xfffffffffffffffc) + 4);
  pcVar1 = this->typeTagsCurrent_;
  this->typeTagsCurrent_ = pcVar1 + -1;
  pcVar1[-1] = 's';
  strcpy(this->argumentCurrent_,rhs);
  sVar2 = strlen(rhs);
  uVar3 = sVar2 + 1;
  this->argumentCurrent_ = this->argumentCurrent_ + uVar3;
  for (; (uVar3 & 3) != 0; uVar3 = uVar3 + 1) {
    pcVar1 = this->argumentCurrent_;
    this->argumentCurrent_ = pcVar1 + 1;
    *pcVar1 = '\0';
  }
  return this;
}

Assistant:

OutboundPacketStream& OutboundPacketStream::operator<<( const char *rhs )
{
    CheckForAvailableArgumentSpace( RoundUp4(std::strlen(rhs) + 1) );

    *(--typeTagsCurrent_) = STRING_TYPE_TAG;
    std::strcpy( argumentCurrent_, rhs );
    std::size_t rhsLength = std::strlen(rhs);
    argumentCurrent_ += rhsLength + 1;

    // zero pad to 4-byte boundary
    std::size_t i = rhsLength + 1;
    while( i & 0x3 ){
        *argumentCurrent_++ = '\0';
        ++i;
    }

    return *this;
}